

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509cset.cc
# Opt level: O3

int X509_CRL_set_version(X509_CRL *x,long version)

{
  int iVar1;
  ASN1_INTEGER *a;
  
  iVar1 = 0;
  if (x != (X509_CRL *)0x0) {
    if ((ulong)version < 2) {
      a = x->crl->version;
      if (version != 0) {
        if (a == (ASN1_INTEGER *)0x0) {
          a = ASN1_INTEGER_new();
          x->crl->version = a;
          if (a == (ASN1_INTEGER *)0x0) {
            return 0;
          }
        }
        iVar1 = ASN1_INTEGER_set_int64((ASN1_INTEGER *)a,1);
        return iVar1;
      }
      ASN1_INTEGER_free(a);
      x->crl->version = (ASN1_INTEGER *)0x0;
      iVar1 = 1;
    }
    else {
      iVar1 = 0;
      ERR_put_error(0xb,0,0x8c,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509cset.cc"
                    ,0x1e);
    }
  }
  return iVar1;
}

Assistant:

int X509_CRL_set_version(X509_CRL *x, long version) {
  if (x == NULL) {
    return 0;
  }

  if (version < X509_CRL_VERSION_1 || version > X509_CRL_VERSION_2) {
    OPENSSL_PUT_ERROR(X509, X509_R_INVALID_VERSION);
    return 0;
  }

  // v1(0) is default and is represented by omitting the version.
  if (version == X509_CRL_VERSION_1) {
    ASN1_INTEGER_free(x->crl->version);
    x->crl->version = NULL;
    return 1;
  }

  if (x->crl->version == NULL) {
    x->crl->version = ASN1_INTEGER_new();
    if (x->crl->version == NULL) {
      return 0;
    }
  }
  return ASN1_INTEGER_set_int64(x->crl->version, version);
}